

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderLang.cpp
# Opt level: O0

TObjectReflection * __thiscall glslang::TProgram::getBufferVariable(TProgram *this,int index)

{
  TObjectReflection *pTVar1;
  int index_local;
  TProgram *this_local;
  
  pTVar1 = TReflection::getBufferVariable(this->reflection,index);
  return pTVar1;
}

Assistant:

const TObjectReflection& TProgram::getBufferVariable(int index) const { return reflection->getBufferVariable(index); }